

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_operation.c
# Opt level: O2

int async_operation_cancel(ASYNC_OPERATION_HANDLE async_operation)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x4a;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/async_operation.c"
                ,"async_operation_cancel",0x49,1,"NULL async_operation");
    }
  }
  else {
    (*async_operation->async_operation_cancel_handler)(async_operation);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int async_operation_cancel(ASYNC_OPERATION_HANDLE async_operation)
{
    int result;

    if (async_operation == NULL)
    {
        LogError("NULL async_operation");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_ASYNC_OPERATION_01_007: [ `async_operation_cancel` shall cancel the operation by calling the cancel handler function passed to `async_operation_create`.]*/
        async_operation->async_operation_cancel_handler(async_operation);

        /* Codes_SRS_ASYNC_OPERATION_01_008: [ On success `async_operation_cancel` shall return 0.]*/
        result = 0;
    }

    return result;
}